

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_server_name_is_ipaddr(char *name)

{
  int iVar1;
  undefined1 local_44 [8];
  sockaddr_in6 sin6;
  sockaddr_in sin;
  char *name_local;
  
  iVar1 = inet_pton(2,name,(void *)((long)&sin6.sin6_addr.__in6_u + 0xc));
  if (iVar1 == 1) {
    name_local._4_4_ = 1;
  }
  else {
    iVar1 = inet_pton(10,name,local_44);
    if (iVar1 == 1) {
      name_local._4_4_ = 1;
    }
    else {
      name_local._4_4_ = 0;
    }
  }
  return name_local._4_4_;
}

Assistant:

int ptls_server_name_is_ipaddr(const char *name)
{
#ifdef AF_INET
    struct sockaddr_in sin;
    if (inet_pton(AF_INET, name, &sin) == 1)
        return 1;
#endif
#ifdef AF_INET6
    struct sockaddr_in6 sin6;
    if (inet_pton(AF_INET6, name, &sin6) == 1)
        return 1;
#endif
    return 0;
}